

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS node(REF_MPI ref_mpi,int argc,char **argv)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GRID_conflict ref_grid;
  uint local_38;
  REF_INT local;
  REF_INT global;
  REF_INT pos;
  char *in_file;
  char **argv_local;
  REF_MPI pRStack_18;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  _ref_private_macro_code_rss_1 = (REF_GRID)0x0;
  in_file = (char *)argv;
  argv_local._4_4_ = argc;
  pRStack_18 = ref_mpi;
  if (ref_mpi->n < 2) {
    if (argc < 4) {
      if (ref_mpi->id == 0) {
        quilt_help(*argv);
      }
      ref_mpi_local._4_4_ = 1;
    }
    else {
      _global = argv[2];
      printf("import %s\n",_global);
      uVar1 = ref_import_by_extension((REF_GRID *)&ref_private_macro_code_rss_1,pRStack_18,_global);
      if (uVar1 == 0) {
        for (local = 3; local < argv_local._4_4_; local = local + 1) {
          local_38 = atoi(*(char **)(in_file + (long)local * 8));
          printf("global index %d\n",(ulong)local_38);
          uVar1 = ref_node_local(_ref_private_macro_code_rss_1->node,(long)(int)local_38,
                                 (REF_INT *)((long)&ref_grid + 4));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1008,"node",(ulong)uVar1,"global node_index not found");
            return uVar1;
          }
          uVar1 = ref_node_location(_ref_private_macro_code_rss_1->node,ref_grid._4_4_);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x1009,"node",(ulong)uVar1,"location");
            return uVar1;
          }
        }
        ref_mpi_local._4_4_ = ref_grid_free(_ref_private_macro_code_rss_1);
        if (ref_mpi_local._4_4_ == 0) {
          ref_mpi_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x100c,"node",(ulong)ref_mpi_local._4_4_,"create");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1002,"node",(ulong)uVar1,"load surface");
        ref_mpi_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xffc,"node",6,"ref node is not parallel");
    ref_mpi_local._4_4_ = 6;
  }
  return ref_mpi_local._4_4_;
}

Assistant:

static REF_STATUS node(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *in_file;
  REF_INT pos, global, local;
  REF_GRID ref_grid = NULL;

  if (ref_mpi_para(ref_mpi)) {
    RSS(REF_IMPLEMENT, "ref node is not parallel");
  }
  if (argc < 4) goto shutdown;
  in_file = argv[2];

  printf("import %s\n", in_file);
  RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "load surface");

  for (pos = 3; pos < argc; pos++) {
    global = atoi(argv[pos]);
    printf("global index %d\n", global);
    RSS(ref_node_local(ref_grid_node(ref_grid), global, &local),
        "global node_index not found");
    RSS(ref_node_location(ref_grid_node(ref_grid), local), "location");
  }

  RSS(ref_grid_free(ref_grid), "create");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) quilt_help(argv[0]);
  return REF_FAILURE;
}